

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::Lex::MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
          (Lex *this,DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree,String *regExpr,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
          *macroSyntaxTrees)

{
  undefined1 *this_00;
  RegExprDFAParseHandler *this_01;
  uint pos;
  bool bVar1;
  int iVar2;
  RegExprDFANode *pRVar3;
  RegExprDFAParseElement *pRVar4;
  RegExprDFANode *pnodeRoot;
  RegExprDFANode *pnodeAccept;
  allocator<char> local_3f9;
  String local_3f8;
  allocator<char> local_3d1;
  String local_3d0;
  undefined1 local_3b0 [8];
  ParseMessage msg;
  RegExprDFAParseHandler parseHandler;
  Parse<SGParser::Generator::RegExprDFAParseElement> parse;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  MemBufferInputStream inputStream;
  undefined1 local_190 [8];
  Grammar grammar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  *macroSyntaxTrees_local;
  String *regExpr_local;
  DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree_local;
  Lex *this_local;
  
  grammar.Messages.pMessages = (Messages *)macroSyntaxTrees;
  if ((MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
       ::parseTable == '\0') &&
     (iVar2 = __cxa_guard_acquire(&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
                                   ::parseTable), iVar2 != 0)) {
    ParseTableGen::ParseTableGen(&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable);
    __cxa_atexit(ParseTableGen::~ParseTableGen,
                 &MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable,&__dso_handle);
    __cxa_guard_release(&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
                         ::parseTable);
  }
  bVar1 = ParseTable::IsValid(&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.
                               super_ParseTable);
  if (!bVar1) {
    Grammar::Grammar((Grammar *)local_190);
    CreateRegExpGrammar(this,(Grammar *)local_190);
    bVar1 = ParseTableGen::Create
                      (&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable,
                       (Grammar *)local_190,CLR);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    Grammar::~Grammar((Grammar *)local_190);
    if (!bVar1) goto LAB_00190c23;
  }
  this_00 = &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38;
  MemBufferInputStream::MemBufferInputStream((MemBufferInputStream *)this_00,regExpr);
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8),(InputStream *)this_00);
  Parse<SGParser::Generator::RegExprDFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)
             &parseHandler.Nodes.
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8),0x800);
  this_01 = (RegExprDFAParseHandler *)((long)&msg.FileName.field_2 + 8);
  RegExprDFAParseHandler::RegExprDFAParseHandler(this_01);
  parseHandler.super_ParseHandler<SGParser::Generator::RegExprDFAParseElement>._vptr_ParseHandler.
  _0_4_ = 0;
  parseHandler.super_ParseHandler<SGParser::Generator::RegExprDFAParseElement>._vptr_ParseHandler.
  _4_4_ = 0;
  parseHandler.pLex = (Lex *)grammar.Messages.pMessages;
  parseHandler._8_8_ = this;
  this_local._7_1_ =
       Parse<SGParser::Generator::RegExprDFAParseElement>::DoParse
                 ((Parse<SGParser::Generator::RegExprDFAParseElement> *)
                  &parseHandler.Nodes.
                   super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (ParseHandler<SGParser::Generator::RegExprDFAParseElement> *)this_01);
  if ((bool)this_local._7_1_) {
    pRVar3 = (RegExprDFANode *)operator_new(0x80);
    pos = parseHandler.super_ParseHandler<SGParser::Generator::RegExprDFAParseElement>.
          _vptr_ParseHandler._4_4_;
    parseHandler.super_ParseHandler<SGParser::Generator::RegExprDFAParseElement>._vptr_ParseHandler.
    _4_4_ = parseHandler.super_ParseHandler<SGParser::Generator::RegExprDFAParseElement>.
            _vptr_ParseHandler._4_4_ + 1;
    RegExprDFANode::RegExprDFANode(pRVar3,Char,pos,1);
    pRVar3->AcceptingState = 1;
    pnodeRoot = pRVar3;
    pRVar3 = (RegExprDFANode *)operator_new(0x80);
    RegExprDFANode::RegExprDFANode(pRVar3,And);
    pRVar3->pParent = (RegExprDFANode *)0x0;
    pRVar4 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)
                        &parseHandler.Nodes.
                         super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    RegExprDFANode::Add(pRVar3,(pRVar4->field_1).pNode);
    RegExprDFANode::Add(pRVar3,pnodeRoot);
    RegExprDFANode::Setup(pRVar3);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back((vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                 *)&parseHandler.pMacroSyntaxTrees,&pnodeRoot);
    tree->pRoot = pRVar3;
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::operator=(&tree->CharNodes,
                (vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                 *)&parseHandler.pMacroSyntaxTrees);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"",&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"DFA Syntax Tree: Regular expression parsing error",&local_3f9);
    std::__cxx11::string::string((string *)&pnodeAccept);
    ParseMessage::ParseMessage
              ((ParseMessage *)local_3b0,ErrorMessage,&local_3d0,&local_3f8,0,0xffffffffffffffff,
               0xffffffffffffffff,(String *)&pnodeAccept,0);
    std::__cxx11::string::~string((string *)&pnodeAccept);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)local_3b0);
    ParseMessage::~ParseMessage((ParseMessage *)local_3b0);
  }
  RegExprDFAParseHandler::~RegExprDFAParseHandler
            ((RegExprDFAParseHandler *)((long)&msg.FileName.field_2 + 8));
  Parse<SGParser::Generator::RegExprDFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)
             &parseHandler.Nodes.
              super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::~RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)
             ((long)&parse.ErrorStackStr.field_2 + 8));
  MemBufferInputStream::~MemBufferInputStream
            ((MemBufferInputStream *)
             &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
LAB_00190c23:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Lex::MakeSyntaxTree(DFASyntaxTree<T>& tree, const String& regExpr,
                         std::map<String, DFASyntaxTree<T>*>& macroSyntaxTrees) {
    // Cache the parse table
    static ParseTableGen parseTable;

    if (!parseTable.IsValid()) {
        Grammar grammar;
        // Create the hard coded Regular Expression grammar
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!parseTable.Create(grammar))
            return false; // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExpr};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprDFAParseElement> parse{&parseTable, &tokenizer};
    RegExprDFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID          = 0u;
    parseHandler.PositionCount     = 0u;
    parseHandler.pLex              = this;
    parseHandler.pMacroSyntaxTrees = &macroSyntaxTrees;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "DFA Syntax Tree: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Append the final accepting node
    // Make the fake accept character node
    const auto pnodeAccept      = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                     parseHandler.PositionCount++, 1u};
    pnodeAccept->AcceptingState = 1u;
    // Make the root node
    const auto pnodeRoot        = new RegExprDFANode{RegExprDFANode::NodeType::And};
    pnodeRoot->pParent          = nullptr;
    pnodeRoot->Add(parse[0].pNode);
    pnodeRoot->Add(pnodeAccept);
    pnodeRoot->Setup();

    // Add the accept node to the nodes list
    parseHandler.Nodes.push_back(pnodeAccept);

    // Set the destination tree data
    tree.pRoot     = pnodeRoot;
    tree.CharNodes = parseHandler.Nodes;

    return true;
}